

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

int bcm2835_aux_spi_begin(void)

{
  uint32_t *paddr;
  uint16_t divider;
  uint32_t *paddr_00;
  uint32_t *paddr_01;
  bool bVar1;
  uint32_t *cntl1;
  uint32_t *cntl0;
  uint32_t *enable;
  
  paddr = bcm2835_spi1;
  paddr_00 = bcm2835_aux + 1;
  paddr_01 = bcm2835_spi1 + 1;
  bVar1 = bcm2835_spi1 != (uint32_t *)0xffffffffffffffff;
  if (bVar1) {
    bcm2835_gpio_fsel('\x10','\x03');
    bcm2835_gpio_fsel('\x13','\x03');
    bcm2835_gpio_fsel('\x14','\x03');
    bcm2835_gpio_fsel('\x15','\x03');
    divider = bcm2835_aux_spi_CalcClockDivider(1000000);
    bcm2835_aux_spi_setClockDivider(divider);
    bcm2835_peri_write(paddr_00,2);
    bcm2835_peri_write(paddr_01,0);
    bcm2835_peri_write(paddr,0x200);
  }
  enable._4_4_ = (uint)bVar1;
  return enable._4_4_;
}

Assistant:

int bcm2835_aux_spi_begin(void)
{
    volatile uint32_t* enable = bcm2835_aux + BCM2835_AUX_ENABLE/4;
    volatile uint32_t* cntl0 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL0/4;
    volatile uint32_t* cntl1 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL1/4;

    if (bcm2835_spi1 == MAP_FAILED)
	return 0; /* bcm2835_init() failed, or not root */

    /* Set the SPI pins to the Alt 4 function to enable SPI1 access on them */
    bcm2835_gpio_fsel(RPI_V2_GPIO_P1_36, BCM2835_GPIO_FSEL_ALT4);	/* SPI1_CE2_N */
    bcm2835_gpio_fsel(RPI_V2_GPIO_P1_35, BCM2835_GPIO_FSEL_ALT4);	/* SPI1_MISO */
    bcm2835_gpio_fsel(RPI_V2_GPIO_P1_38, BCM2835_GPIO_FSEL_ALT4);	/* SPI1_MOSI */
    bcm2835_gpio_fsel(RPI_V2_GPIO_P1_40, BCM2835_GPIO_FSEL_ALT4);	/* SPI1_SCLK */

    bcm2835_aux_spi_setClockDivider(bcm2835_aux_spi_CalcClockDivider(1000000));	// Default 1MHz SPI

    bcm2835_peri_write(enable, BCM2835_AUX_ENABLE_SPI0);
    bcm2835_peri_write(cntl1, 0);
    bcm2835_peri_write(cntl0, BCM2835_AUX_SPI_CNTL0_CLEARFIFO);

    return 1; /* OK */
}